

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O2

void __thiscall antlr::Parser::match(Parser *this,BitSet *b)

{
  bool bVar1;
  int iVar2;
  uint el;
  int numTokens_;
  ostream *poVar3;
  MismatchedTokenException *this_00;
  undefined4 extraout_var;
  RefToken local_80;
  BitSet local_78;
  string local_50;
  
  if (DEBUG_PARSER == '\x01') {
    (*this->_vptr_Parser[0x1b])(this);
    poVar3 = std::operator<<((ostream *)&std::cout,"enter match(");
    poVar3 = std::operator<<(poVar3,"bitset");
    poVar3 = std::operator<<(poVar3,") with LA(1)=");
    iVar2 = (*this->_vptr_Parser[2])(this,1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  el = (*this->_vptr_Parser[2])(this,1);
  bVar1 = BitSet::member(b,el);
  if (bVar1) {
    (*this->_vptr_Parser[0xc])(this);
    return;
  }
  if (DEBUG_PARSER == '\x01') {
    (*this->_vptr_Parser[0x1b])(this);
    poVar3 = std::operator<<((ostream *)&std::cout,"token mismatch: ");
    iVar2 = (*this->_vptr_Parser[2])(this,1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," not member of ");
    poVar3 = std::operator<<(poVar3,"bitset");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  this_00 = (MismatchedTokenException *)__cxa_allocate_exception(200);
  iVar2 = (*this->_vptr_Parser[0x19])(this);
  numTokens_ = (*this->_vptr_Parser[0x1a])(this);
  (*this->_vptr_Parser[3])(&local_80,this,1);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_78.storage,&b->storage);
  (*this->_vptr_Parser[8])(&local_50,this);
  MismatchedTokenException::MismatchedTokenException
            (this_00,(char **)CONCAT44(extraout_var,iVar2),numTokens_,&local_80,&local_78,false,
             &local_50);
  __cxa_throw(this_00,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void match(const BitSet& b)
	{
		if ( DEBUG_PARSER )
		{
			traceIndent();
			ANTLR_USE_NAMESPACE(std)cout << "enter match(" << "bitset" /*b.toString()*/
				<< ") with LA(1)=" << LA(1) << ANTLR_USE_NAMESPACE(std)endl;
		}
		if ( !b.member(LA(1)) )
		{
			if ( DEBUG_PARSER )
			{
				traceIndent();
				ANTLR_USE_NAMESPACE(std)cout << "token mismatch: " << LA(1) << " not member of "
					<< "bitset" /*b.toString()*/ << ANTLR_USE_NAMESPACE(std)endl;
			}
			throw MismatchedTokenException(getTokenNames(), getNumTokens(), LT(1), b, false, getFilename());
		}
		else
		{
			// mark token as consumed -- fetch next token deferred until LA/LT
			consume();
		}
	}